

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EventControlSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EventControlSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  EventControlSyntax *pEVar6;
  
  pEVar6 = (EventControlSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EventControlSyntax *)this->endPtr < pEVar6 + 1) {
    pEVar6 = (EventControlSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pEVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pEVar6->super_TimingControlSyntax).super_SyntaxNode.kind = EventControl;
  (pEVar6->super_TimingControlSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar6->super_TimingControlSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pEVar6->at).kind = TVar2;
  (pEVar6->at).field_0x2 = uVar3;
  (pEVar6->at).numFlags = (NumericTokenFlags)NVar4.raw;
  (pEVar6->at).rawLen = uVar5;
  (pEVar6->at).info = pIVar1;
  (pEVar6->eventName).ptr = args_1;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pEVar6;
  return pEVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }